

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo_history.cpp
# Opt level: O3

void __thiscall undo::UndoHistory::deleteState(UndoHistory *this,UndoState *state)

{
  UndoHistoryDelegate *pUVar1;
  
  pUVar1 = this->m_delegate;
  if (pUVar1 != (UndoHistoryDelegate *)0x0) {
    (**(code **)(*(long *)pUVar1 + 0x10))(pUVar1,state);
  }
  if ((state != (UndoState *)0x0) && (state->m_cmd != (UndoCommand *)0x0)) {
    (*state->m_cmd->_vptr_UndoCommand[4])();
  }
  operator_delete(state);
  return;
}

Assistant:

void UndoHistory::deleteState(UndoState* state)
{
  if (m_delegate)
    m_delegate->onDeleteUndoState(state);

  delete state;
}